

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O3

FT_UInt32 tt_cmap8_char_next(TT_CMap cmap,FT_UInt32 *pchar_code)

{
  uint uVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  FT_UInt32 FVar8;
  FT_UInt32 FVar9;
  byte *pbVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  uint uVar19;
  uint uVar20;
  
  if (*pchar_code == 0xffffffff) {
    return 0;
  }
  uVar11 = *(uint *)(cmap->data + 0x200c);
  uVar11 = uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 | uVar11 << 0x18;
  FVar8 = 0;
  if (uVar11 == 0) {
    FVar9 = 0;
  }
  else {
    pbVar10 = cmap->data + 0x2010;
    uVar17 = *pchar_code + 1;
    do {
      uVar3 = (uint)*pbVar10;
      uVar4 = (uint)pbVar10[1];
      uVar5 = (uint)pbVar10[2];
      bVar2 = pbVar10[3];
      uVar7 = uVar4 * 0x10000 + uVar3 * 0x1000000 | uVar5 * 0x100 | (uint)bVar2;
      uVar15 = (uint)pbVar10[5] * 0x10000 + (uint)pbVar10[4] * 0x1000000 | (uint)pbVar10[6] << 8 |
               (uint)pbVar10[7];
      uVar6 = uVar7;
      if (uVar7 < uVar17) {
        uVar6 = uVar17;
      }
      uVar16 = uVar6;
      if (uVar6 <= uVar15) {
        iVar12 = (uint)pbVar10[8] * 0x1000000;
        iVar18 = (uint)pbVar10[9] * 0x10000;
        uVar13 = (uint)pbVar10[10] * 0x100;
        uVar20 = (uint)pbVar10[0xb];
        uVar19 = ~uVar6 + uVar5 * 0x100 + (uint)bVar2 + uVar3 * 0x1000000 + uVar4 * 0x10000;
        iVar14 = 0;
        do {
          uVar16 = uVar6 + iVar14;
          if (uVar19 < (iVar18 + iVar12 | uVar13 | uVar20)) break;
          if (((iVar18 + uVar13 + uVar20 + uVar6 + iVar12) - (uint)bVar2) + uVar5 * -0x100 +
              uVar4 * -0x10000 + uVar3 * -0x1000000 + iVar14 != 0) {
            if (((uVar6 + iVar12 + iVar18 + uVar13 + uVar20) - (uint)bVar2) + uVar5 * -0x100 +
                uVar4 * -0x10000 + uVar3 * -0x1000000 + iVar14 <
                (uint)((cmap->cmap).charmap.face)->num_glyphs) {
              if (uVar7 < uVar17) {
                uVar7 = uVar17;
              }
              FVar9 = uVar7 + iVar14;
              FVar8 = ((iVar12 + iVar18 + uVar13 + uVar20 + uVar7) - (uint)bVar2) + uVar5 * -0x100 +
                      uVar4 * -0x10000 + uVar3 * -0x1000000 + iVar14;
              goto LAB_00240809;
            }
            break;
          }
          if (uVar16 == 0xffffffff) {
            FVar8 = 0;
            FVar9 = 0;
            goto LAB_00240809;
          }
          uVar1 = uVar6 + iVar14;
          iVar14 = iVar14 + 1;
          uVar19 = uVar19 - 1;
          uVar16 = ((uint)pbVar10[4] * 0x1000000 | (uint)pbVar10[5] * 0x10000 |
                   (uint)pbVar10[6] << 8) + (uint)pbVar10[7] + 1;
        } while (uVar1 < uVar15);
      }
      uVar17 = uVar16;
      pbVar10 = pbVar10 + 0xc;
      uVar11 = uVar11 - 1;
    } while (uVar11 != 0);
    FVar9 = 0;
    FVar8 = 0;
  }
LAB_00240809:
  *pchar_code = FVar9;
  return FVar8;
}

Assistant:

FT_CALLBACK_DEF( FT_UInt32 )
  tt_cmap8_char_next( TT_CMap     cmap,
                      FT_UInt32  *pchar_code )
  {
    FT_Face    face       = cmap->cmap.charmap.face;
    FT_UInt32  result     = 0;
    FT_UInt32  char_code;
    FT_UInt    gindex     = 0;
    FT_Byte*   table      = cmap->data;
    FT_Byte*   p          = table + 8204;
    FT_UInt32  num_groups = TT_NEXT_ULONG( p );
    FT_UInt32  start, end, start_id;


    if ( *pchar_code >= 0xFFFFFFFFUL )
      return 0;

    char_code = *pchar_code + 1;

    p = table + 8208;

    for ( ; num_groups > 0; num_groups-- )
    {
      start    = TT_NEXT_ULONG( p );
      end      = TT_NEXT_ULONG( p );
      start_id = TT_NEXT_ULONG( p );

      if ( char_code < start )
        char_code = start;

    Again:
      if ( char_code <= end )
      {
        /* ignore invalid group */
        if ( start_id > 0xFFFFFFFFUL - ( char_code - start ) )
          continue;

        gindex = (FT_UInt)( start_id + ( char_code - start ) );

        /* does first element of group point to `.notdef' glyph? */
        if ( gindex == 0 )
        {
          if ( char_code >= 0xFFFFFFFFUL )
            break;

          char_code++;
          goto Again;
        }

        /* if `gindex' is invalid, the remaining values */
        /* in this group are invalid, too               */
        if ( gindex >= (FT_UInt)face->num_glyphs )
        {
          gindex = 0;
          continue;
        }

        result = char_code;
        break;
      }
    }

    *pchar_code = result;
    return gindex;
  }